

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_enum_decl(gvisitor_t *self,gnode_enum_decl_t *node)

{
  return;
}

Assistant:

static void visit_enum_decl (gvisitor_t *self, gnode_enum_decl_t *node) {
    #pragma unused(self,node)
    DEBUG_CODEGEN("visit_enum_decl %s", node->identifier);

    // enum is a map at runtime
    // enum foo {a=1,b=2,...}
    // is translated to
    // var foo = [a:1,b:2,...]
}